

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void anon_unknown.dwarf_b9c::CodeOneFrame
               (double *log_spectral_envelope,double *frequency_axis,int fft_size,double *mel_axis,
               fft_complex *weight,int max_dimension,int number_of_dimensions,
               ForwardRealFFT *forward_real_fft,double *coded_spectral_envelope)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *yi;
  double *mel_spectrum;
  int max_dimension_local;
  fft_complex *weight_local;
  double *mel_axis_local;
  int fft_size_local;
  double *frequency_axis_local;
  double *log_spectral_envelope_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max_dimension;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  yi = (double *)operator_new__(uVar2);
  interp1(frequency_axis,log_spectral_envelope,fft_size / 2 + 1,mel_axis,max_dimension,yi);
  DCTForCodec(yi,max_dimension,weight,forward_real_fft,number_of_dimensions,coded_spectral_envelope)
  ;
  if (yi != (double *)0x0) {
    operator_delete__(yi);
  }
  return;
}

Assistant:

static void CodeOneFrame(const double *log_spectral_envelope,
    const double *frequency_axis, int fft_size, const double *mel_axis,
    const fft_complex *weight, int max_dimension, int number_of_dimensions,
    const ForwardRealFFT *forward_real_fft, double *coded_spectral_envelope) {
  double *mel_spectrum = new double[max_dimension];
  interp1(frequency_axis, log_spectral_envelope, fft_size / 2 + 1,
      mel_axis, max_dimension, mel_spectrum);

  // DCT
  DCTForCodec(mel_spectrum, max_dimension, weight, forward_real_fft,
      number_of_dimensions, coded_spectral_envelope);

  delete[] mel_spectrum;
}